

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O0

void tr_partition(saidx_t *ISAd,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t **pa,
                 saidx_t **pb,saidx_t v)

{
  saidx_t sVar1;
  int iVar2;
  bool bVar3;
  int local_74;
  int local_70;
  saidx_t x;
  saidx_t s;
  saidx_t t;
  saidx_t *f;
  saidx_t *e;
  saidx_t *d;
  saidx_t *c;
  saidx_t *b;
  saidx_t *a;
  saidx_t **pb_local;
  saidx_t **pa_local;
  saidx_t *last_local;
  saidx_t *middle_local;
  saidx_t *first_local;
  saidx_t *ISAd_local;
  
  local_74 = 0;
  c = middle + -1;
  do {
    c = c + 1;
    bVar3 = false;
    if (c < last) {
      local_74 = ISAd[*c];
      bVar3 = local_74 == v;
    }
  } while (bVar3);
  d = last;
  b = c;
  if ((c < last) && (local_74 < v)) {
    while( true ) {
      c = c + 1;
      bVar3 = false;
      if (c < last) {
        local_74 = ISAd[*c];
        bVar3 = local_74 <= v;
      }
      if (!bVar3) break;
      if (local_74 == v) {
        iVar2 = *c;
        *c = *b;
        *b = iVar2;
        b = b + 1;
      }
    }
  }
  do {
    e = d + -1;
    bVar3 = false;
    if (c < e) {
      local_74 = ISAd[*e];
      bVar3 = local_74 == v;
    }
    d = e;
  } while (bVar3);
  if ((c < e) && (v < local_74)) {
    while( true ) {
      d = d + -1;
      bVar3 = false;
      if (c < d) {
        local_74 = ISAd[*d];
        bVar3 = v <= local_74;
      }
      if (!bVar3) break;
      if (local_74 == v) {
        iVar2 = *d;
        *d = *e;
        *e = iVar2;
        e = e + -1;
      }
    }
  }
  while (c < d) {
    sVar1 = *c;
    *c = *d;
    *d = sVar1;
    while( true ) {
      c = c + 1;
      bVar3 = false;
      if (c < d) {
        local_74 = ISAd[*c];
        bVar3 = local_74 <= v;
      }
      if (!bVar3) break;
      if (local_74 == v) {
        iVar2 = *c;
        *c = *b;
        *b = iVar2;
        b = b + 1;
      }
    }
    while( true ) {
      d = d + -1;
      bVar3 = false;
      if (c < d) {
        local_74 = ISAd[*d];
        bVar3 = v <= local_74;
      }
      if (!bVar3) break;
      if (local_74 == v) {
        iVar2 = *d;
        *d = *e;
        *e = iVar2;
        e = e + -1;
      }
    }
  }
  pa_local = (saidx_t **)last;
  middle_local = first;
  if (b <= e) {
    local_70 = (int)((long)b - (long)first >> 2);
    iVar2 = (int)((long)c - (long)b >> 2);
    if (iVar2 < local_70) {
      local_70 = iVar2;
    }
    _s = c + -(long)local_70;
    f = first;
    for (; 0 < local_70; local_70 = local_70 + -1) {
      sVar1 = *f;
      *f = *_s;
      *_s = sVar1;
      f = f + 1;
      _s = _s + 1;
    }
    local_70 = (int)((long)e - (long)(c + -1) >> 2);
    iVar2 = (int)((long)last - (long)e >> 2) + -1;
    if (iVar2 < local_70) {
      local_70 = iVar2;
    }
    f = c;
    _s = last + -(long)local_70;
    for (; 0 < local_70; local_70 = local_70 + -1) {
      sVar1 = *f;
      *f = *_s;
      *_s = sVar1;
      f = f + 1;
      _s = _s + 1;
    }
    middle_local = first + ((long)c - (long)b >> 2);
    pa_local = (saidx_t **)(last + -((long)e - (long)(c + -1) >> 2));
  }
  *pa = middle_local;
  *pb = (saidx_t *)pa_local;
  return;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}